

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::fix_after_remove(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,node *t)

{
  node *in_RSI;
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar1;
  node *sibling_1;
  node *sibling;
  node *local_20;
  node *local_18;
  node *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    bVar1 = false;
    if (local_10 != in_RDI->tree_root) {
      bVar1 = local_10->color == '\x01';
    }
    if (!bVar1) break;
    if (local_10->parent->left == local_10) {
      local_18 = local_10->parent->right;
      if (local_18->color == '\0') {
        local_18->color = '\x01';
        local_10->parent->color = '\0';
        rotate_left(in_RDI,local_10->parent);
        local_18 = local_10->parent->right;
      }
      if ((local_18->left->color == '\x01') && (local_18->right->color == '\x01')) {
        local_18->color = '\0';
        local_10 = local_10->parent;
      }
      else {
        if (local_18->right->color == '\x01') {
          local_18->left->color = '\x01';
          local_18->color = '\0';
          rotate_right(in_RDI,local_18);
          local_18 = local_10->parent->right;
        }
        local_18->color = local_10->parent->color;
        local_10->parent->color = '\x01';
        local_18->right->color = '\x01';
        rotate_left(in_RDI,local_10->parent);
        local_10 = in_RDI->tree_root;
      }
    }
    else {
      local_20 = local_10->parent->left;
      if (local_20->color == '\0') {
        local_20->color = '\x01';
        local_10->parent->color = '\0';
        rotate_right(in_RDI,local_10->parent);
        local_20 = local_10->parent->left;
      }
      if ((local_20->left->color == '\x01') && (local_20->right->color == '\x01')) {
        local_20->color = '\0';
        local_10 = local_10->parent;
      }
      else {
        if (local_20->left->color == '\x01') {
          local_20->right->color = '\x01';
          local_20->color = '\0';
          rotate_left(in_RDI,local_20);
          local_20 = local_10->parent->left;
        }
        local_20->color = local_10->parent->color;
        local_10->parent->color = '\x01';
        local_20->left->color = '\x01';
        rotate_right(in_RDI,local_10->parent);
        local_10 = in_RDI->tree_root;
      }
    }
  }
  local_10->color = '\x01';
  return;
}

Assistant:

void binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    fix_after_remove (
        node* t
    )
    {

        while (t != tree_root && t->color == black)
        {
            if (t->parent->left == t)
            {
                node* sibling = t->parent->right;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_left(t->parent);
                    sibling = t->parent->right;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->right->color == black)
                    {
                        sibling->left->color = black;
                        sibling->color = red;
                        rotate_right(sibling);
                        sibling = t->parent->right;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->right->color = black;
                    rotate_left(t->parent);
                    t = tree_root;

                }


            }
            else
            {

                node* sibling = t->parent->left;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_right(t->parent);
                    sibling = t->parent->left;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->left->color == black)
                    {
                        sibling->right->color = black;
                        sibling->color = red;
                        rotate_left(sibling);
                        sibling = t->parent->left;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->left->color = black;
                    rotate_right(t->parent);
                    t = tree_root;

                }


            }

        }
        t->color = black;
    
    }